

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

string * __thiscall
rcg::Device::getSerialNumber_abi_cxx11_(string *__return_storage_ptr__,Device *this)

{
  DEVICE_INFO_CMD in_R8D;
  
  std::mutex::lock(&this->mtx);
  (anonymous_namespace)::cDevGetInfo_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Device *)&this->gentl,
             (shared_ptr<const_rcg::GenTLWrapper> *)0x7,in_R8D);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::string Device::getSerialNumber()
{
  std::lock_guard<std::mutex> lock(mtx);
  return cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_SERIAL_NUMBER);
}